

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::DynamicMapField::MergeFrom(DynamicMapField *this,MapFieldBase *other)

{
  bool value;
  int iVar1;
  int iVar2;
  int32 value_00;
  uint32 value_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FieldDescriptor *pFVar3;
  Message *pMVar4;
  Message *pMVar5;
  uint64 value_02;
  int64 value_03;
  string *value_04;
  MapValueRef *map_val;
  float value_05;
  double value_06;
  const_iterator other_it;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_78;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_60;
  FieldDescriptor *local_58;
  string local_50;
  
  iVar1 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x14])();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((const_iterator *)&local_78,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(other + 1));
  if (local_78.node_ != (Node *)0x0) {
    local_60 = &this->map_;
    do {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
                ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
                  *)&local_50,*(InnerMap **)(CONCAT44(extraout_var,iVar1) + 0x10),
                 &(((local_78.node_)->kv).v_)->first,(TreeIterator *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        map_val = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                            (local_60,&(((local_78.node_)->kv).v_)->first);
        AllocateMapValue(this,map_val);
      }
      else {
        map_val = (MapValueRef *)(*(long *)(local_50._M_dataplus._M_p + 0x10) + 0x10);
      }
      iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"value","");
      pFVar3 = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var_00,iVar2),&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (*(once_flag **)(pFVar3 + 0x30) != (once_flag *)0x0) {
        local_50._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_58 = pFVar3;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar3 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_50,
                   &local_58);
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar3 + 0x38) * 4)) {
      case 1:
        value_00 = MapValueRef::GetInt32Value(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetInt32Value(map_val,value_00);
        break;
      case 2:
        value_03 = MapValueRef::GetInt64Value(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetInt64Value(map_val,value_03);
        break;
      case 3:
        value_01 = MapValueRef::GetUInt32Value(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetUInt32Value(map_val,value_01);
        break;
      case 4:
        value_02 = MapValueRef::GetUInt64Value(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetUInt64Value(map_val,value_02);
        break;
      case 5:
        value_06 = MapValueRef::GetDoubleValue(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetDoubleValue(map_val,value_06);
        break;
      case 6:
        value_05 = MapValueRef::GetFloatValue(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetFloatValue(map_val,value_05);
        break;
      case 7:
        value = MapValueRef::GetBoolValue(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetBoolValue(map_val,value);
        break;
      case 8:
        iVar2 = MapValueRef::GetEnumValue(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetEnumValue(map_val,iVar2);
        break;
      case 9:
        value_04 = MapValueRef::GetStringValue_abi_cxx11_(&(((local_78.node_)->kv).v_)->second);
        MapValueRef::SetStringValue(map_val,value_04);
        break;
      case 10:
        pMVar4 = MapValueRef::MutableMessageValue(map_val);
        pMVar5 = MapValueRef::GetMessageValue(&(((local_78.node_)->kv).v_)->second);
        (*(pMVar4->super_MessageLite)._vptr_MessageLite[0x10])(pMVar4,pMVar5);
      }
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
      ::operator++(&local_78);
    } while (local_78.node_ != (Node *)0x0);
  }
  return;
}

Assistant:

void DynamicMapField::MergeFrom(const MapFieldBase& other) {
  GOOGLE_DCHECK(IsMapValid() && other.IsMapValid());
  Map<MapKey, MapValueRef>* map = MutableMap();
  const DynamicMapField& other_field =
      reinterpret_cast<const DynamicMapField&>(other);
  for (Map<MapKey, MapValueRef>::const_iterator other_it =
           other_field.map_.begin();
       other_it != other_field.map_.end(); ++other_it) {
    Map<MapKey, MapValueRef>::iterator iter = map->find(other_it->first);
    MapValueRef* map_val;
    if (iter == map->end()) {
      map_val = &map_[other_it->first];
      AllocateMapValue(map_val);
    } else {
      map_val = &iter->second;
    }

    // Copy map value
    const FieldDescriptor* field_descriptor =
        default_entry_->GetDescriptor()->FindFieldByName("value");
    switch (field_descriptor->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        map_val->SetInt32Value(other_it->second.GetInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_INT64: {
        map_val->SetInt64Value(other_it->second.GetInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT32: {
        map_val->SetUInt32Value(other_it->second.GetUInt32Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_UINT64: {
        map_val->SetUInt64Value(other_it->second.GetUInt64Value());
        break;
      }
      case FieldDescriptor::CPPTYPE_FLOAT: {
        map_val->SetFloatValue(other_it->second.GetFloatValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_DOUBLE: {
        map_val->SetDoubleValue(other_it->second.GetDoubleValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_BOOL: {
        map_val->SetBoolValue(other_it->second.GetBoolValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING: {
        map_val->SetStringValue(other_it->second.GetStringValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_ENUM: {
        map_val->SetEnumValue(other_it->second.GetEnumValue());
        break;
      }
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        map_val->MutableMessageValue()->CopyFrom(
            other_it->second.GetMessageValue());
        break;
      }
    }
  }
}